

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedTest.cpp
# Opt level: O3

void __thiscall oout::TimedTest::TimedTest(TimedTest *this,shared_ptr<const_oout::Test> *test)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TimedTest_00120748;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (test->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (test->super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->test).super___shared_ptr<const_oout::Test,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TimedTest::TimedTest(const shared_ptr<const Test> &test)
	: test(test)
{
}